

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict st_assert(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  token_t ptVar2;
  node_t_conflict op2;
  pos_t p;
  node_t_conflict pnVar3;
  char *expected_name;
  parse_ctx_t parse_ctx;
  int token_code;
  
  ppVar1 = c2m_ctx->parse_ctx;
  if (*(short *)ppVar1->curr_token == 0x117) {
    p = ppVar1->curr_token->pos;
    read_token(c2m_ctx);
    if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x28) {
      read_token(c2m_ctx);
      pnVar3 = cond_expr(c2m_ctx,no_err_p);
      if (pnVar3 == &err_struct) {
        return &err_struct;
      }
      if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x2c) {
        read_token(c2m_ctx);
        ptVar2 = c2m_ctx->parse_ctx->curr_token;
        if (*(short *)ptVar2 != 0x102) {
          if (ppVar1->record_level != 0) {
            return &err_struct;
          }
          expected_name = "string";
          goto LAB_00197a6d;
        }
        op2 = ptVar2->node;
        read_token(c2m_ctx);
        if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
          read_token(c2m_ctx);
          if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x3b) {
            read_token(c2m_ctx);
            pnVar3 = new_node2(c2m_ctx,N_ST_ASSERT,pnVar3,op2);
            add_pos(c2m_ctx,pnVar3,p);
            return pnVar3;
          }
          if (ppVar1->record_level != 0) {
            return &err_struct;
          }
          token_code = 0x3b;
        }
        else {
          if (ppVar1->record_level != 0) {
            return &err_struct;
          }
          token_code = 0x29;
        }
      }
      else {
        if (ppVar1->record_level != 0) {
          return &err_struct;
        }
        token_code = 0x2c;
      }
    }
    else {
      if (ppVar1->record_level != 0) {
        return &err_struct;
      }
      token_code = 0x28;
    }
  }
  else {
    if (ppVar1->record_level != 0) {
      return &err_struct;
    }
    token_code = 0x117;
  }
  expected_name = get_token_name(c2m_ctx,token_code);
LAB_00197a6d:
  syntax_error(c2m_ctx,expected_name);
  return &err_struct;
}

Assistant:

D (st_assert) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t op1, r;
  pos_t pos;

  PTP (T_STATIC_ASSERT, pos);
  PT ('(');
  P (const_expr);
  op1 = r;
  PT (',');
  PTN (T_STR);
  PT (')');
  PT (';');
  r = new_pos_node2 (c2m_ctx, N_ST_ASSERT, pos, op1, r);
  return r;
}